

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O3

bool __thiscall Path::executable(Path *this)

{
  int iVar1;
  int *piVar2;
  string *__return_storage_ptr__;
  char *args;
  bool bVar3;
  string local_48;
  
  bVar3 = false;
  iVar1 = access((this->_data)._M_dataplus._M_p,0);
  if (iVar1 == 0) {
    iVar1 = access((this->_data)._M_dataplus._M_p,1);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0xd) {
        __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"access error {1}: {2}","");
        iVar1 = *piVar2;
        args = strerror(iVar1);
        format<int,char*>(__return_storage_ptr__,1,&local_48,iVar1,args);
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
    }
    bVar3 = iVar1 == 0;
  }
  return bVar3;
}

Assistant:

bool Path::executable () const
{
  if (! exists ())
    return false;

  auto status = access (_data.c_str (), X_OK);
  if (status == -1 && errno != EACCES)
    throw format ("access error {1}: {2}", errno, strerror (errno));

  return status == 0;
}